

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::select_variables(solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int unaff_R15D;
  bool bVar7;
  bool bVar8;
  double dVar9;
  
  iVar4 = sizes->c_size;
  iVar2 = iVar4 + bkmin;
  if (bkmin == bkmax) {
    if (sizes->r_size < iVar2) {
      iVar2 = sizes->r_size;
    }
    iVar4 = iVar2 + -1;
  }
  else {
    iVar3 = bkmax + iVar4;
    if (sizes->r_size < bkmax + iVar4) {
      iVar3 = sizes->r_size;
    }
    bVar1 = iVar3 < iVar2;
    if (iVar2 <= iVar3) {
      unaff_R15D = iVar4 + -1 + bkmin;
      lVar6 = ((long)bkmin + (long)iVar4) * 0x10;
      lVar5 = (long)bkmin + (long)iVar4;
      do {
        dVar9 = *(double *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar6);
        bVar8 = dVar9 == 0.0;
        bVar7 = dVar9 < 0.0;
        if ((bVar8) && (!NAN(dVar9))) {
          dVar9 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar8 = dVar9 == 0.5;
          bVar7 = 0.5 < dVar9;
        }
        if (!bVar7 && !bVar8) break;
        bVar1 = iVar3 <= lVar5;
        unaff_R15D = unaff_R15D + 1;
        lVar6 = lVar6 + 0x10;
        lVar5 = lVar5 + 1;
      } while (iVar3 != unaff_R15D);
    }
    iVar4 = iVar3 + -1;
    if (!bVar1) {
      iVar4 = unaff_R15D;
    }
  }
  return iVar4;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }